

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O1

void __thiscall
flatbuffers::dart::DartGenerator::TableBuilderBody
          (DartGenerator *this,StructDef *struct_def,
          vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
          *non_deprecated_fields,string *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  FieldDef *def;
  Namespace *current_namespace;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  long *plVar6;
  ulong *puVar7;
  undefined8 uVar8;
  pointer ppVar9;
  string *psVar10;
  string field_var;
  string add_field;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  int local_114;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  DartGenerator *local_d0;
  string local_c8;
  vector<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
  *local_a8;
  IdlNamer *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  string local_78;
  StructDef *local_58;
  string local_50;
  
  local_d0 = this;
  local_a8 = non_deprecated_fields;
  std::__cxx11::string::append((char *)code);
  local_58 = struct_def;
  NumToString<unsigned_long>
            (&local_180,
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(struct_def->fields).vec.
                   super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_180,0,(char *)0x0,0x36fc6f);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138.field_2._8_8_ = plVar3[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar5;
    local_138._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_138._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0.field_2._8_8_ = plVar3[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar5;
    local_f0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code,(ulong)local_f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar1) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  local_140 = code;
  std::__cxx11::string::append((char *)code);
  ppVar9 = (local_a8->
           super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (ppVar9 != (local_a8->
                super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_a0 = &local_d0->namer_;
    do {
      def = ppVar9->second;
      local_114 = ppVar9->first;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"add","");
      (*(local_a0->super_Namer)._vptr_Namer[3])(&local_f0,local_a0,&local_138,def);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      (*(local_a0->super_Namer)._vptr_Namer[7])(&local_138,local_a0,def);
      BVar2 = (def->value).type.base_type;
      if (BVar2 - BASE_TYPE_UTYPE < 0xc) {
        std::operator+(&local_160,"  int ",&local_f0);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180.field_2._8_8_ = plVar3[3];
          local_180._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_180._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        current_namespace = (local_58->super_Definition).defined_namespace;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
        GenDartTypeName(&local_180,local_d0,&(def->value).type,current_namespace,def,&local_78);
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_160,"? ",&local_138);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180.field_2._8_8_ = plVar3[3];
          local_180._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_180._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        GenType_abi_cxx11_(&local_50,local_d0,&(def->value).type);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x36fc89);
        local_98 = &local_88;
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_88 = *plVar6;
          lStack_80 = plVar3[3];
        }
        else {
          local_88 = *plVar6;
          local_98 = (long *)*plVar3;
        }
        local_90 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        puVar7 = (ulong *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar7) {
          local_110.field_2._M_allocated_capacity = *puVar7;
          local_110.field_2._8_8_ = plVar3[3];
        }
        else {
          local_110.field_2._M_allocated_capacity = *puVar7;
          local_110._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_110._M_string_length = plVar3[1];
        *plVar3 = (long)puVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        NumToString<int>(&local_c8,local_114);
        uVar8 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          uVar8 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar8 < local_c8._M_string_length + local_110._M_string_length) {
          uVar8 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            uVar8 = local_c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar8 < local_c8._M_string_length + local_110._M_string_length)
          goto LAB_001dce82;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_c8,0,(char *)0x0,(ulong)local_110._M_dataplus._M_p);
        }
        else {
LAB_001dce82:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_110,(ulong)local_c8._M_dataplus._M_p);
        }
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        psVar5 = puVar4 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_160.field_2._M_allocated_capacity = *psVar5;
          local_160.field_2._8_8_ = puVar4[3];
        }
        else {
          local_160.field_2._M_allocated_capacity = *psVar5;
          local_160._M_dataplus._M_p = (pointer)*puVar4;
        }
        local_160._M_string_length = puVar4[1];
        *puVar4 = psVar5;
        puVar4[1] = 0;
        *(undefined1 *)psVar5 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180.field_2._8_8_ = plVar3[3];
          local_180._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar5;
          local_180._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_180._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        psVar10 = local_140;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_138._M_dataplus._M_p);
        if ((def->value).type.enum_def != (EnumDef *)0x0) {
          std::__cxx11::string::append((char *)psVar10);
        }
        std::__cxx11::string::append((char *)psVar10);
      }
      else {
        if ((BVar2 == BASE_TYPE_STRUCT) && (((def->value).type.struct_def)->fixed == true)) {
          std::operator+(&local_160,"  int ",&local_f0);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180.field_2._8_8_ = plVar3[3];
            local_180._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_180._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar1) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          NumToString<int>(&local_110,local_114);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x36fca5);
          psVar5 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_160.field_2._M_allocated_capacity = *psVar5;
            local_160.field_2._8_8_ = puVar4[3];
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar5;
            local_160._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_160._M_string_length = puVar4[1];
          *puVar4 = psVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180.field_2._8_8_ = plVar3[3];
            local_180._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_180._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        }
        else {
          std::operator+(&local_160,"  int ",&local_f0);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180.field_2._8_8_ = plVar3[3];
            local_180._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_180._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != paVar1) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          NumToString<int>(&local_110,local_114);
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,0x36fcdd);
          psVar5 = puVar4 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_160.field_2._M_allocated_capacity = *psVar5;
            local_160.field_2._8_8_ = puVar4[3];
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar5;
            local_160._M_dataplus._M_p = (pointer)*puVar4;
          }
          local_160._M_string_length = puVar4[1];
          *puVar4 = psVar5;
          puVar4[1] = 0;
          *(undefined1 *)(puVar4 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_160);
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180.field_2._8_8_ = plVar3[3];
            local_180._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_180.field_2._M_allocated_capacity = *psVar5;
            local_180._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_180._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_180._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar1) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        psVar10 = local_140;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          psVar10 = local_140;
        }
      }
      std::__cxx11::string::append((char *)psVar10);
      std::__cxx11::string::append((char *)psVar10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != (local_a8->
                       super__Vector_base<std::pair<int,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<int,_flatbuffers::FieldDef_*>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  psVar10 = local_140;
  std::__cxx11::string::append((char *)local_140);
  std::__cxx11::string::append((char *)psVar10);
  std::__cxx11::string::append((char *)psVar10);
  std::__cxx11::string::append((char *)psVar10);
  return;
}

Assistant:

void TableBuilderBody(
      const StructDef &struct_def,
      const std::vector<std::pair<int, FieldDef *>> &non_deprecated_fields,
      std::string &code) {
    code += "  void begin() {\n";
    code += "    fbBuilder.startTable(" +
            NumToString(struct_def.fields.vec.size()) + ");\n";
    code += "  }\n\n";

    for (auto it = non_deprecated_fields.begin();
         it != non_deprecated_fields.end(); ++it) {
      const auto &field = *it->second;
      const auto offset = it->first;
      const std::string add_field = namer_.Method("add", field);
      const std::string field_var = namer_.Variable(field);

      if (IsScalar(field.value.type.base_type)) {
        code += "  int " + add_field + "(";
        code += GenDartTypeName(field.value.type, struct_def.defined_namespace,
                                field);
        code += "? " + field_var + ") {\n";
        code += "    fbBuilder.add" + GenType(field.value.type) + "(" +
                NumToString(offset) + ", ";
        code += field_var;
        if (field.value.type.enum_def) { code += "?.value"; }
        code += ");\n";
      } else if (IsStruct(field.value.type)) {
        code += "  int " + add_field + "(int offset) {\n";
        code +=
            "    fbBuilder.addStruct(" + NumToString(offset) + ", offset);\n";
      } else {
        code += "  int " + add_field + "Offset(int? offset) {\n";
        code +=
            "    fbBuilder.addOffset(" + NumToString(offset) + ", offset);\n";
      }
      code += "    return fbBuilder.offset;\n";
      code += "  }\n";
    }

    code += "\n";
    code += "  int finish() {\n";
    code += "    return fbBuilder.endTable();\n";
    code += "  }\n";
  }